

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

void __thiscall
Imf_3_4::IDManifest::serialize(IDManifest *this,vector<char,_std::allocator<char>_> *data)

{
  char v;
  bool bVar1;
  int iVar2;
  int iVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  size_t sVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  ArgExc *this_00;
  pointer pCVar12;
  uint uVar13;
  int entries;
  ulong uVar14;
  pointer ppVar15;
  undefined8 extraout_RDX;
  size_t i;
  int iVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  pointer __n;
  uint64_t value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_t s;
  ulong uVar20;
  _Base_ptr p_Var21;
  size_t s_1;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> RLEmapping;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sortedIndices;
  vector<char,_std::allocator<char>_> storageSchemes;
  char *outPtr;
  char local_f0 [16];
  _Rb_tree_node_base *local_e0;
  vector<int,_std::allocator<int>_> stringIndices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prefixedStringList;
  string prevString;
  indexedStringSet stringSet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  stringSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &stringSet._M_t._M_impl.super__Rb_tree_header._M_header;
  stringSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  stringSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  stringSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar12 = (this->_manifest).
            super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            ._M_impl.super__Vector_impl_data._M_start;
  stringSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       stringSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar22 = 0;
      uVar22 < (ulong)(((long)(this->_manifest).
                              super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12) / 0xd0);
      uVar22 = uVar22 + 1) {
    p_Var5 = *(_Base_ptr *)((long)&pCVar12[uVar22]._table._M_t + 0x18);
    while (p_Var5 != (_Rb_tree_node_base *)((long)&pCVar12[uVar22]._table._M_t + 8U)) {
      lVar17 = 0;
      for (uVar20 = 0; uVar20 < (ulong)((long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent >> 5);
          uVar20 = uVar20 + 1) {
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&stringSet,
                              (key_type *)((long)&(p_Var5[1]._M_parent)->_M_color + lVar17));
        *pmVar4 = *pmVar4 + 1;
        lVar17 = lVar17 + 0x20;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      pCVar12 = (this->_manifest).
                super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&prefixedStringList,stringSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
           (allocator_type *)&prevString);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&sortedIndices,stringSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (allocator_type *)&prevString);
  prevString._M_dataplus._M_p = (pointer)&prevString.field_2;
  prevString._M_string_length = 0;
  prevString.field_2._M_local_buf[0] = '\0';
  lVar17 = 0;
  p_Var5 = stringSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&RLEmapping;
    if ((_Rb_tree_header *)p_Var5 == &stringSet._M_t._M_impl.super__Rb_tree_header) break;
    if (lVar17 == 0) {
      std::__cxx11::string::_M_assign
                ((string *)
                 prefixedStringList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    else {
      p_Var10 = p_Var5 + 1;
      for (p_Var21 = (_Base_ptr)0x0;
          (((p_Var21 != (_Base_ptr)0xffff && ((_Base_ptr)prevString._M_string_length != p_Var21)) &&
           (p_Var21 < p_Var5[1]._M_parent)) &&
          (prevString._M_dataplus._M_p[(long)p_Var21] ==
           *(char *)((long)&p_Var21->_M_color + *(long *)p_Var10)));
          p_Var21 = (_Base_ptr)((long)&p_Var21->_M_color + 1)) {
      }
      if (prevString._M_string_length < 0x100) {
        RLEmapping.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)&RLEmapping.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct((ulong)__lhs,'\x01');
        std::__cxx11::string::substr((ulong)&storageSchemes,(ulong)p_Var10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stringIndices,__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &storageSchemes);
        std::__cxx11::string::operator=
                  ((string *)
                   (prefixedStringList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar17),(string *)&stringIndices);
        std::__cxx11::string::~string((string *)&stringIndices);
        std::__cxx11::string::~string((string *)&storageSchemes);
      }
      else {
        storageSchemes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&storageSchemes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct((ulong)&storageSchemes,'\x01');
        outPtr = local_f0;
        std::__cxx11::string::_M_construct((ulong)&outPtr,'\x01');
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &RLEmapping,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &storageSchemes,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outPtr)
        ;
        std::__cxx11::string::substr((ulong)&local_50,(ulong)p_Var10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stringIndices,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &RLEmapping,&local_50);
        std::__cxx11::string::operator=
                  ((string *)
                   (prefixedStringList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar17),(string *)&stringIndices);
        std::__cxx11::string::~string((string *)&stringIndices);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&RLEmapping);
        std::__cxx11::string::~string((string *)&outPtr);
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&storageSchemes
        ;
      }
      std::__cxx11::string::~string((string *)__lhs);
    }
    std::__cxx11::string::_M_assign((string *)&prevString);
    sortedIndices.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar17].first = -p_Var5[2]._M_color;
    sortedIndices.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar17].second = (_Rb_tree_color)lVar17;
    p_Var5[2]._M_color = (_Rb_tree_color)lVar17;
    lVar17 = lVar17 + 1;
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (sortedIndices.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start,
             sortedIndices.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish);
  uVar20 = (long)sortedIndices.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)sortedIndices.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar22 = 0x80;
  if (uVar20 < 0x80) {
    uVar22 = uVar20;
  }
  for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
    sortedIndices.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar14].first = 1;
  }
  uVar14 = 0x4000;
  if (uVar20 < 0x4000) {
    uVar14 = uVar20;
  }
  ppVar15 = sortedIndices.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start + uVar22;
  for (; uVar22 < uVar14; uVar22 = uVar22 + 1) {
    ppVar15->first = 2;
    ppVar15 = ppVar15 + 1;
  }
  uVar14 = 0x200000;
  if (uVar20 < 0x200000) {
    uVar14 = uVar20;
  }
  for (; uVar22 < uVar14; uVar22 = uVar22 + 1) {
    ppVar15->first = 3;
    ppVar15 = ppVar15 + 1;
  }
  uVar14 = 0x10000000;
  if (uVar20 < 0x10000000) {
    uVar14 = uVar20;
  }
  for (; uVar22 < uVar14; uVar22 = uVar22 + 1) {
    ppVar15->first = 4;
    ppVar15 = ppVar15 + 1;
  }
  for (; uVar22 < uVar20; uVar22 = uVar22 + 1) {
    ppVar15->first = 5;
    ppVar15 = ppVar15 + 1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ();
  __n = (pointer)((long)sortedIndices.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)sortedIndices.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::vector
            (&stringIndices,(size_type)__n,(allocator_type *)&RLEmapping);
  RLEmapping.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RLEmapping.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  RLEmapping.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (sortedIndices.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      sortedIndices.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar19 = 0;
  }
  else {
    uVar22 = 1;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize(&RLEmapping,1);
    iVar2 = (sortedIndices.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start)->second;
    (RLEmapping.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
     _M_impl.super__Vector_impl_data._M_start)->first = iVar2;
    (RLEmapping.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
     _M_impl.super__Vector_impl_data._M_start)->second = iVar2;
    for (__n = stringIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        __n != stringIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish; __n = __n + 1) {
      *__n = -1;
    }
    stringIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[(sortedIndices.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start)->second] = 0;
    piVar6 = (pointer)(ulong)(stringIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start
                              [(sortedIndices.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->second] + 1);
    for (; uVar22 < (ulong)((long)sortedIndices.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)sortedIndices.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar22 = uVar22 + 1) {
      if (sortedIndices.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar22].second == (int)piVar6) {
        RLEmapping.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].second = (int)piVar6;
      }
      else {
        storageSchemes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(sortedIndices.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar22].second,
                               sortedIndices.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar22].second);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  (&RLEmapping,(value_type *)&storageSchemes);
      }
      stringIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[sortedIndices.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar22].second] = (int)uVar22;
      piVar7 = (pointer)(long)sortedIndices.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar22].second;
      uVar13 = (uint)((ulong)((long)stringIndices.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)stringIndices.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
      uVar19 = sortedIndices.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar22].second + 1;
      if ((int)uVar19 <= (int)uVar13) {
        uVar19 = uVar13;
      }
      __n = (pointer)(ulong)uVar19;
      piVar8 = piVar7;
      do {
        piVar7 = (pointer)((long)piVar7 + 1);
        piVar6 = __n;
        if ((long)(int)uVar13 <= (long)piVar7) break;
        piVar6 = (pointer)(ulong)((int)piVar8 + 1);
        piVar8 = piVar6;
      } while (-1 < stringIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)piVar7]);
    }
    uVar19 = (int)RLEmapping.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
             (int)RLEmapping.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start & 0xfffffff8;
  }
  iVar2 = (anonymous_namespace)::
          getStringListSize<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (&prefixedStringList,(size_t)__n);
  iVar2 = iVar2 + uVar19 + 0xc;
  storageSchemes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  storageSchemes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  storageSchemes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar22 = 0;
  do {
    pCVar12 = (this->_manifest).
              super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_manifest).
                       super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12) / 0xd0) <= uVar22
       ) {
      std::vector<char,_std::allocator<char>_>::resize(data,(long)iVar2);
      outPtr = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Xdr::write<Imf_3_4::CharPtrIO,char*>(&outPtr,0);
      (anonymous_namespace)::
      writeStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&outPtr,&prefixedStringList,entries);
      Xdr::write<Imf_3_4::CharPtrIO,char*>
                (&outPtr,(int)((ulong)((long)RLEmapping.
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)RLEmapping.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3));
      for (uVar22 = 0;
          uVar22 < (ulong)((long)RLEmapping.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)RLEmapping.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar22 = uVar22 + 1) {
        Xdr::write<Imf_3_4::CharPtrIO,char*>
                  (&outPtr,RLEmapping.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar22].first);
        Xdr::write<Imf_3_4::CharPtrIO,char*>
                  (&outPtr,RLEmapping.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar22].second);
      }
      Xdr::write<Imf_3_4::CharPtrIO,char*>
                (&outPtr,(int)(((long)(this->_manifest).
                                      super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->_manifest).
                                     super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0xd0));
      uVar22 = 0;
      while( true ) {
        pCVar12 = (this->_manifest).
                  super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar17 = (long)(this->_manifest).
                       super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12;
        if ((ulong)(lVar17 / 0xd0) <= uVar22) break;
        Xdr::write<Imf_3_4::CharPtrIO,char*>
                  (&outPtr,*(int *)((long)&pCVar12[uVar22]._channels._M_t + 0x28));
        auVar23._8_8_ = extraout_RDX;
        auVar23._0_8_ = *(_Base_ptr *)((long)&pCVar12[uVar22]._channels._M_t + 0x18);
        p_Var10 = (_Rb_tree_node_base *)((long)&pCVar12[uVar22]._channels._M_t + 8);
        while( true ) {
          p_Var11 = auVar23._0_8_;
          if (p_Var11 == p_Var10) break;
          anon_unknown_2::writeVariableLengthInteger(&outPtr,(long)*(int *)&p_Var11[1]._M_parent);
          auVar23 = std::_Rb_tree_increment(p_Var11);
        }
        auVar24._8_8_ = auVar23._8_8_;
        auVar24._0_8_ = *(_Base_ptr *)((long)&pCVar12[uVar22]._channels._M_t + 0x18);
        while (p_Var11 = auVar24._0_8_, p_Var11 != p_Var10) {
          CharPtrIO::writeChars(&outPtr,*(char **)(p_Var11 + 1),*(int *)&p_Var11[1]._M_parent);
          auVar24 = std::_Rb_tree_increment(p_Var11);
        }
        (anonymous_namespace)::
        writeStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&outPtr,&pCVar12[uVar22]._components,auVar24._8_4_);
        Xdr::write<Imf_3_4::CharPtrIO,char*>(&outPtr,(char)pCVar12[uVar22]._lifeTime);
        anon_unknown_2::writePascalString(&outPtr,&pCVar12[uVar22]._hashScheme);
        anon_unknown_2::writePascalString(&outPtr,&pCVar12[uVar22]._encodingScheme);
        v = storageSchemes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar22];
        Xdr::write<Imf_3_4::CharPtrIO,char*>(&outPtr,v);
        Xdr::write<Imf_3_4::CharPtrIO,char*>
                  (&outPtr,*(int *)((long)&pCVar12[uVar22]._table._M_t + 0x28));
        local_e0 = (_Rb_tree_node_base *)((long)&pCVar12[uVar22]._table._M_t + 8);
        lVar17 = 0;
        for (p_Var5 = *(_Base_ptr *)((long)&pCVar12[uVar22]._table._M_t + 0x18); p_Var5 != local_e0;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          value = *(long *)(p_Var5 + 1) - lVar17;
          if (v == '\x02') {
            anon_unknown_2::writeVariableLengthInteger(&outPtr,value);
          }
          else if (v == '\x01') {
            Xdr::write<Imf_3_4::CharPtrIO,char*>(&outPtr,(uint)value);
          }
          else if (v == '\0') {
            Xdr::write<Imf_3_4::CharPtrIO,char*>(&outPtr,value);
          }
          lVar17 = *(long *)(p_Var5 + 1);
          lVar18 = 0;
          for (uVar20 = 0;
              uVar20 < (ulong)((long)*(pointer *)
                                      ((long)&pCVar12[uVar22]._components.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      + 8) -
                               *(long *)&pCVar12[uVar22]._components.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl >> 5); uVar20 = uVar20 + 1) {
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&stringSet,
                                  (key_type *)((long)&(p_Var5[1]._M_parent)->_M_color + lVar18));
            anon_unknown_2::writeVariableLengthInteger
                      (&outPtr,(long)stringIndices.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[*pmVar4]);
            lVar18 = lVar18 + 0x20;
          }
        }
        uVar22 = uVar22 + 1;
      }
      if (outPtr != (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48,uVar22,lVar17 % 0xd0);
        Iex_3_4::ArgExc::ArgExc(this_00,"Error - IDManifest size error");
        __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&storageSchemes.super__Vector_base<char,_std::allocator<char>_>);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&RLEmapping.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&stringIndices.super__Vector_base<int,_std::allocator<int>_>);
      std::__cxx11::string::~string((string *)&prevString);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&sortedIndices.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&prefixedStringList);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&stringSet._M_t);
      return;
    }
    iVar16 = 4;
    uVar20 = uVar22;
    for (p_Var10 = *(_Base_ptr *)((long)&pCVar12[uVar22]._channels._M_t + 0x18);
        p_Var10 != (_Rb_tree_node_base *)((long)&pCVar12[uVar22]._channels._M_t + 8U);
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      p_Var5 = p_Var10[1]._M_parent;
      sVar9 = anon_unknown_2::getVariableLengthIntegerSize((uint64_t)p_Var5);
      iVar16 = (int)sVar9 + iVar16 + (int)p_Var5;
    }
    iVar3 = (anonymous_namespace)::
            getStringListSize<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&pCVar12[uVar22]._components,uVar20);
    iVar2 = iVar2 + iVar16 + iVar3 + (int)pCVar12[uVar22]._hashScheme._M_string_length +
            (int)pCVar12[uVar22]._encodingScheme._M_string_length + 0xe;
    bVar1 = true;
    uVar20 = 0;
    p_Var10 = *(_Base_ptr *)((long)&pCVar12[uVar22]._table._M_t + 0x18);
    p_Var11 = (_Rb_tree_node_base *)0x0;
    while (p_Var10 != (_Rb_tree_node_base *)((long)&pCVar12[uVar22]._table._M_t + 8U)) {
      local_e0 = *(_Rb_tree_node_base **)(p_Var10 + 1);
      uVar14 = (long)local_e0 - (long)p_Var11;
      sVar9 = anon_unknown_2::getVariableLengthIntegerSize(uVar14);
      uVar20 = uVar20 + sVar9;
      bVar1 = (bool)(bVar1 & uVar14 >> 0x20 == 0);
      lVar17 = 0;
      for (uVar14 = 0;
          uVar14 < (ulong)((long)*(pointer *)
                                  ((long)&pCVar12[uVar22]._components.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  + 8) -
                           *(long *)&pCVar12[uVar22]._components.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl >> 5); uVar14 = uVar14 + 1) {
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&stringSet,
                              (key_type *)((long)&(p_Var10[1]._M_parent)->_M_color + lVar17));
        sVar9 = anon_unknown_2::getVariableLengthIntegerSize
                          ((long)stringIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_start[*pmVar4]);
        iVar2 = iVar2 + (int)sVar9;
        lVar17 = lVar17 + 0x20;
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      p_Var11 = local_e0;
    }
    sVar9 = *(size_t *)((long)&pCVar12[uVar22]._table._M_t + 0x28);
    if (bVar1) {
      if (uVar20 < sVar9 << 2) {
        outPtr = (char *)CONCAT71(outPtr._1_7_,2);
        std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  (&storageSchemes,(char *)&outPtr);
LAB_0017f53f:
        iVar2 = iVar2 + (int)uVar20;
      }
      else {
        outPtr = (char *)CONCAT71(outPtr._1_7_,1);
        std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  (&storageSchemes,(char *)&outPtr);
        iVar2 = iVar2 + *(int *)((long)&pCVar12[uVar22]._table._M_t + 0x28) * 4;
      }
    }
    else {
      if (uVar20 < sVar9 << 3) {
        outPtr = (char *)CONCAT71(outPtr._1_7_,2);
        std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  (&storageSchemes,(char *)&outPtr);
        goto LAB_0017f53f;
      }
      outPtr = (char *)((ulong)outPtr._1_7_ << 8);
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&storageSchemes,(char *)&outPtr);
      iVar2 = iVar2 + *(int *)((long)&pCVar12[uVar22]._table._M_t + 0x28) * 8;
    }
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

void
IDManifest::serialize (std::vector<char>& data) const
{

    indexedStringSet stringSet;

    //
    // build string map - this turns unique strings into indices
    // the manifest stores the string indices - this allows duplicated
    // strings to point to the same place
    // grabs all the strings regardless of which manifest/mapping they are in
    //
    // at this point we just count the manifest entries
    //
    {
        //
        // over each channel group
        //
        for (size_t m = 0; m < _manifest.size (); ++m)
        {
            // over each mapping
            for (IDManifest::ChannelGroupManifest::IDTable::const_iterator i =
                     _manifest[m]._table.begin ();
                 i != _manifest[m]._table.end ();
                 ++i)
            {
                // over each string in the mapping

                for (size_t s = 0; s < i->second.size (); ++s)
                {
                    stringSet[i->second[s]]++;
                }
            }
        }
    }

    //
    // build compressed string representation - all but first string starts with number of characters to copy from previous string.
    // max 65535 bytes - use two bytes to store if previous string was more than 255 characters, big endian
    //
    vector<string> prefixedStringList (stringSet.size ());

    //
    // also make a sorted list so the most common entry appears first. Keep equally likely entries in numerical order
    //
    vector<pair<int, int>> sortedIndices (stringSet.size ());

    string prevString;
    int    index = 0;
    for (indexedStringSet::iterator i = stringSet.begin ();
         i != stringSet.end ();
         ++i)
    {

        // no prefix on first string - map stores index of each string, so use that rather than a counter;
        if (index == 0) { prefixedStringList[index] = i->first; }
        else
        {
            size_t common = 0;
            while (common < 65535 && common < prevString.size () &&
                   common < i->first.size () &&
                   prevString[common] == i->first[common])
            {
                ++common;
            }

            if (prevString.size () > 255)
            {
                //
                // long previous string - use two bytes to encode number of common chars
                //
                prefixedStringList[index] = string (1, char (common >> 8)) +
                                            string (1, char (common & 255)) +
                                            i->first.substr (common);
            }
            else
            {
                prefixedStringList[index] =
                    string (1, char (common)) + i->first.substr (common);
            }
        }
        prevString = i->first;
        sortedIndices[index].first =
            -i->second; // use negative of count so largest count appears first
        sortedIndices[index].second = index;

        //
        // also, repurpose stringSet so that it maps from string names to indices in the string table
        //
        i->second = index;

        index++;
    }

    sort (sortedIndices.begin (), sortedIndices.end ());

    //
    // the first 1<<7 characters will all be encoded with 1 byte, regardless of how common they are
    // the next 1<<14 characters will be encoded with 2 bytes
    // (a full huffman encode would do this at the bit level, not the byte level)
    //
    // the mapping table can be reduced in size by rewriting the IDs to exploit that
    // can rearrange the IDs to have more long runs by sorting numbers
    // that will need the same number of bytes to encode together
    //
    {
        size_t i = 0;

        for (; i < sortedIndices.size () && i < 1 << 7; ++i)
        {
            sortedIndices[i].first = 1;
        }
        for (; i < sortedIndices.size () && i < 1 << 14; ++i)
        {
            sortedIndices[i].first = 2;
        }
        for (; i < sortedIndices.size () && i < 1 << 21; ++i)
        {
            sortedIndices[i].first = 3;
        }
        for (; i < sortedIndices.size () && i < 1 << 28; ++i)
        {
            sortedIndices[i].first = 4;
        }
        for (; i < sortedIndices.size (); ++i)
        {
            sortedIndices[i].first = 5;
        }
    }
    sort (sortedIndices.begin (), sortedIndices.end ());

    vector<int> stringIndices (sortedIndices.size ());

    //
    // table will be stored with RLE encoding - store pairs of 'start index,end index'
    // so, the sequence 10,11,12,1,2,3,4  is stored as [ (10,12) , (1,4)]
    //
    // sequential IDs ignore already referenced IDs, so the sequence  11,9,10,12,13 can be stored as [ (11,11) , (9,13)]
    // on reading, don't reference an entry that has already been seen
    // on writing, need to track which entries have already been stored to allow this overlapping to occur
    //

    vector<pair<int, int>> RLEmapping;

    if (sortedIndices.size () > 0)
    {
        RLEmapping.resize (1);
        RLEmapping[0].first  = sortedIndices[0].second;
        RLEmapping[0].second = sortedIndices[0].second;

        fill (stringIndices.begin (), stringIndices.end (), -1);

        stringIndices[sortedIndices[0].second] = 0;

        //
        // as the loop below runs, nextToInclude tracks the value that can be merged with the current run length
        // (RLWmapping.back()) - generally this is on more than the current length, but it jumps forward
        // over values already seen
        //
        int nextToInclude = stringIndices[sortedIndices[0].second] + 1;

        for (size_t i = 1; i < sortedIndices.size (); ++i)
        {
            if (sortedIndices[i].second == nextToInclude)
            {
                //
                // this index can be treated as part of the current run, so extend the run to include it
                //
                RLEmapping.back ().second = sortedIndices[i].second;
            }
            else
            {
                pair<int, int> newEntry (
                    sortedIndices[i].second, sortedIndices[i].second);
                RLEmapping.push_back (newEntry);
            }
            // build mapping for this entry
            stringIndices[sortedIndices[i].second] = i;

            // what would the next entry have to be to be included in this run
            // skip over already mapped strings
            nextToInclude = sortedIndices[i].second + 1;

            while (nextToInclude < int (stringIndices.size ()) &&
                   stringIndices[nextToInclude] >= 0)
            {
                nextToInclude++;
            }
        }
    }
#ifdef DUMP_TABLE
    // dump RLE table for debugging
    for (size_t i = 1; i < sortedIndices.size (); ++i)
    {
        std::cout << i << ' ' << sortedIndices[i].second << std::endl;
    }
#endif

    // now compute size of uncompressed memory block for serialization

    int outputSize =
        8; // at least need four bytes for integer to store number of channel manifests, plus four bytes to indicate version pattern

    outputSize += getStringListSize (prefixedStringList);

    //
    // RLE mapping table size - number of entries followed by eight bytes for each run length
    //
    outputSize += RLEmapping.size () * 8 + 4;

    //
    // track which storage scheme is optimal for storing the IDs of each type
    // ID storage scheme: 0 = 8 bytes per ID, 1 = 4 bytes per ID, 2 = variable
    //

    std::vector<char> storageSchemes;

    for (size_t groupNumber = 0; groupNumber < _manifest.size (); ++groupNumber)
    {
        const ChannelGroupManifest& m = _manifest[groupNumber];
        outputSize += getStringListSize (m._channels); //size of channel group
        outputSize +=
            getStringListSize (m._components); //size of component list
        outputSize += 1;                       //size of lifetime enum
        outputSize += getStringSize (m._hashScheme);
        outputSize += getStringSize (m._encodingScheme);

        outputSize += 1; // ID scheme
        outputSize +=
            4; // size of storage for number of 32 bit entries in ID table

        uint64_t previousId                 = 0;
        uint64_t IdStorageForVariableScheme = 0;
        bool     canUse32Bits               = true;
        for (IDManifest::ChannelGroupManifest::IDTable::const_iterator i =
                 m._table.begin ();
             i != m._table.end ();
             ++i)
        {

            uint64_t idToStore = i->first - previousId;
            IdStorageForVariableScheme +=
                getVariableLengthIntegerSize (idToStore);
            if (idToStore >= 1llu << 32) { canUse32Bits = false; }
            previousId = i->first;

            for (size_t s = 0; s < m._components.size (); ++s)
            {
                int stringID  = stringSet[i->second[s]];
                int idToWrite = stringIndices[stringID];
                outputSize += getVariableLengthIntegerSize (idToWrite);
            }
        }
        // pick best scheme to use to store IDs
        if (canUse32Bits)
        {
            if (IdStorageForVariableScheme < m._table.size () * 4)
            {
                //
                // variable storage smaller than fixed 32 bit, so use that
                //
                storageSchemes.push_back (2);
                outputSize += IdStorageForVariableScheme;
            }
            else
            {
                //
                // variable scheme bigger than fixed 32 bit, but all ID differences fit into 32 bits
                //
                storageSchemes.push_back (1);
                outputSize += m._table.size () * 4;
            }
        }
        else
        {
            if (IdStorageForVariableScheme < m._table.size () * 8)
            {
                //
                // variable storage smaller than fixed 64 bit, so use that
                //
                storageSchemes.push_back (2);
                outputSize += IdStorageForVariableScheme;
            }
            else
            {
                //
                // variable scheme bigger than fixed 64 bit, and some ID differences bigger than 32 bit
                //
                storageSchemes.push_back (0);
                outputSize += m._table.size () * 8;
            }
        }
    }

    //
    // resize output array
    //
    data.resize (outputSize);

    //
    // populate output array
    //
    char* outPtr = &data[0];

    //
    // zeroes to indicate this is version 0 of the header
    //
    Xdr::write<CharPtrIO> (outPtr, int (0));

    //
    // table of strings
    //
    writeStringList (outPtr, prefixedStringList);

    //
    // RLE block
    //
    Xdr::write<CharPtrIO> (outPtr, int (RLEmapping.size ()));
    for (size_t i = 0; i < RLEmapping.size (); ++i)
    {
        Xdr::write<CharPtrIO> (outPtr, RLEmapping[i].first);
        Xdr::write<CharPtrIO> (outPtr, RLEmapping[i].second);
    }

    //
    // number of manifests
    //
    Xdr::write<CharPtrIO> (outPtr, int (_manifest.size ()));
    int manifestIndex = 0;

    for (size_t groupNumber = 0; groupNumber < _manifest.size (); ++groupNumber)
    {
        const ChannelGroupManifest& m = _manifest[groupNumber];
        //
        // manifest header
        //
        writeStringList (outPtr, m._channels);
        writeStringList (outPtr, m._components);
        Xdr::write<CharPtrIO> (outPtr, char (m._lifeTime));
        writePascalString (outPtr, m._hashScheme);
        writePascalString (outPtr, m._encodingScheme);

        char scheme = storageSchemes[manifestIndex];
        Xdr::write<CharPtrIO> (outPtr, scheme);

        Xdr::write<CharPtrIO> (outPtr, int (m._table.size ()));

        uint64_t previousId = 0;
        //
        // table
        //
        for (IDManifest::ChannelGroupManifest::IDTable::const_iterator i =
                 m._table.begin ();
             i != m._table.end ();
             ++i)
        {

            uint64_t idToWrite = i->first - previousId;
            switch (scheme)
            {
                case 0: Xdr::write<CharPtrIO> (outPtr, idToWrite); break;
                case 1:
                    Xdr::write<CharPtrIO> (outPtr, (unsigned int) idToWrite);
                    break;
                case 2: writeVariableLengthInteger (outPtr, idToWrite);
            }

            previousId = i->first;

            for (size_t s = 0; s < m._components.size (); ++s)
            {
                int stringID  = stringSet[i->second[s]];
                int idToWrite = stringIndices[stringID];
                writeVariableLengthInteger (outPtr, idToWrite);
            }
        }
        manifestIndex++;
    }
    //
    // check we've written the ID manifest correctly
    //
    if (outPtr != &data[0] + data.size ())
    {
        throw IEX_NAMESPACE::ArgExc ("Error - IDManifest size error");
    }
}